

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.h
# Opt level: O3

void __thiscall Semaphore::Semaphore(Semaphore *this,int value)

{
  int iVar1;
  undefined8 *puVar2;
  
  iVar1 = sem_init((sem_t *)this,0,value);
  if (iVar1 == 0) {
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "sem_init: failed";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

Semaphore(int value) {
#ifdef _WIN32
        sem = CreateSemaphore( NULL, value, 1, NULL );
#else
        if (sem_init(&sem, 0, value) != 0)
            throw "sem_init: failed";
#endif
    }